

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O1

void __thiscall Imf_3_2::anon_unknown_6::TileBufferTask::execute(TileBufferTask *this)

{
  pointer pTVar1;
  TileBuffer *pTVar2;
  size_t xStride;
  uint *puVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  Data *pDVar7;
  pointer pTVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  Box2i tileRange;
  char *readPtr;
  char *writePtr;
  char *compPtr;
  char *readPtr_1;
  int local_38;
  
  pTVar2 = this->_tileBuffer;
  writePtr = (char *)(pTVar2->sampleCount)._sizeY;
  pDVar7 = this->_ofd;
  Imf_3_2::dataWindowForTile
            ((Imf_3_2 *)&tileRange,&pDVar7->tileDesc,pDVar7->minX,pDVar7->maxX,pDVar7->minY,
             pDVar7->maxY,(int)pTVar2->dataSize,*(int *)((long)&pTVar2->dataSize + 4),
             (int)pTVar2->uncompressedDataSize,*(int *)((long)&pTVar2->uncompressedDataSize + 4));
  lVar13 = (long)tileRange.max.x;
  lVar11 = (long)tileRange.min.x;
  iVar9 = (int)(lVar13 - lVar11) + 1;
  iVar10 = tileRange.max.y - tileRange.min.y;
  if (tileRange.min.y <= tileRange.max.y) {
    iVar6 = tileRange.min.y;
    do {
      pDVar7 = this->_ofd;
      pTVar8 = (pDVar7->slices).
               super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pDVar7->slices).
          super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish != pTVar8) {
        uVar14 = 0;
        uVar12 = 1;
        do {
          pTVar1 = pTVar8 + uVar14;
          if (pTVar8[uVar14].zero == true) {
            fillChannelWithZeroes(&writePtr,pDVar7->format,pTVar1->type,(long)iVar9);
          }
          else {
            xStride = pTVar1->xStride;
            readPtr = pTVar1->base +
                      (long)(iVar6 - tileRange.min.y * pTVar1->yTileCoords) * pTVar1->yStride +
                      (long)((1 - pTVar1->xTileCoords) * tileRange.min.x) * xStride;
            copyFromFrameBuffer(&writePtr,&readPtr,readPtr + xStride * (lVar13 - lVar11),xStride,
                                pDVar7->format,pTVar1->type);
          }
          pDVar7 = this->_ofd;
          pTVar8 = (pDVar7->slices).
                   super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar14 = ((long)(pDVar7->slices).
                          super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8 >> 4) *
                   -0x5555555555555555;
          bVar15 = uVar12 <= uVar14;
          lVar5 = uVar14 - uVar12;
          uVar14 = uVar12;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (bVar15 && lVar5 != 0);
      }
      bVar15 = iVar6 < tileRange.max.y;
      iVar6 = iVar6 + 1;
    } while (bVar15);
  }
  pTVar2 = this->_tileBuffer;
  puVar3 = (uint *)(pTVar2->sampleCount)._sizeY;
  plVar4 = (long *)pTVar2->buffer;
  *(int *)&pTVar2->uncompressedData = (int)writePtr - (int)puVar3;
  (pTVar2->sampleCount)._data = puVar3;
  if (plVar4 != (long *)0x0) {
    local_38 = tileRange.max.x;
    iVar6 = (**(code **)(*plVar4 + 0x28))();
    pTVar2 = this->_tileBuffer;
    if (iVar6 < *(int *)&pTVar2->uncompressedData) {
      *(int *)&pTVar2->uncompressedData = iVar6;
      (pTVar2->sampleCount)._data = (uint *)compPtr;
    }
    else {
      pDVar7 = this->_ofd;
      if (pDVar7->format == NATIVE) {
        readPtr = (char *)(pTVar2->sampleCount)._sizeY;
        if (-1 < iVar10) {
          readPtr_1 = readPtr;
          iVar6 = 0;
          do {
            pTVar8 = (pDVar7->slices).
                     super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((pDVar7->slices).
                super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish != pTVar8) {
              uVar14 = 0;
              uVar12 = 1;
              do {
                convertInPlace(&readPtr,&readPtr_1,pTVar8[uVar14].type,(long)iVar9);
                pTVar8 = (pDVar7->slices).
                         super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar14 = ((long)(pDVar7->slices).
                                super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8 >> 4) *
                         -0x5555555555555555;
                bVar15 = uVar12 <= uVar14;
                lVar11 = uVar14 - uVar12;
                uVar14 = uVar12;
                uVar12 = (ulong)((int)uVar12 + 1);
              } while (bVar15 && lVar11 != 0);
            }
            bVar15 = iVar6 != iVar10;
            iVar6 = iVar6 + 1;
          } while (bVar15);
        }
      }
    }
  }
  return;
}

Assistant:

void
TileBufferTask::execute ()
{
    try
    {
        //
        // First copy the pixel data from the frame buffer
        // into the tile buffer
        //
        // Convert one tile's worth of pixel data to
        // a machine-independent representation, and store
        // the result in _tileBuffer->buffer.
        //

        char* writePtr = _tileBuffer->buffer;

        Box2i tileRange = dataWindowForTile (
            _ofd->tileDesc,
            _ofd->minX,
            _ofd->maxX,
            _ofd->minY,
            _ofd->maxY,
            _tileBuffer->tileCoord.dx,
            _tileBuffer->tileCoord.dy,
            _tileBuffer->tileCoord.lx,
            _tileBuffer->tileCoord.ly);

        int numScanLines         = tileRange.max.y - tileRange.min.y + 1;
        int numPixelsPerScanLine = tileRange.max.x - tileRange.min.x + 1;

        //
        // Iterate over the scan lines in the tile.
        //

        for (int y = tileRange.min.y; y <= tileRange.max.y; ++y)
        {
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ofd->slices.size (); ++i)
            {
                const TOutSliceInfo& slice = _ofd->slices[i];

                //
                // These offsets are used to facilitate both absolute
                // and tile-relative pixel coordinates.
                //

                int xOffset = slice.xTileCoords * tileRange.min.x;
                int yOffset = slice.yTileCoords * tileRange.min.y;

                //
                // Fill the tile buffer with pixel data.
                //

                if (slice.zero)
                {
                    //
                    // The frame buffer contains no data for this channel.
                    // Store zeroes in _data->tileBuffer.
                    //

                    fillChannelWithZeroes (
                        writePtr,
                        _ofd->format,
                        slice.type,
                        numPixelsPerScanLine);
                }
                else
                {
                    //
                    // The frame buffer contains data for this channel.
                    //

                    intptr_t    base = reinterpret_cast<intptr_t> (slice.base);
                    const char* readPtr = reinterpret_cast<const char*> (
                        base + (y - yOffset) * slice.yStride +
                        (tileRange.min.x - xOffset) * slice.xStride);

                    const char* endPtr =
                        readPtr + (numPixelsPerScanLine - 1) * slice.xStride;

                    copyFromFrameBuffer (
                        writePtr,
                        readPtr,
                        endPtr,
                        slice.xStride,
                        _ofd->format,
                        slice.type);
                }
            }
        }

        //
        // Compress the contents of the tileBuffer,
        // and store the compressed data in the output file.
        //

        _tileBuffer->dataSize = writePtr - _tileBuffer->buffer;
        _tileBuffer->dataPtr  = _tileBuffer->buffer;

        if (_tileBuffer->compressor)
        {
            const char* compPtr;

            int compSize = _tileBuffer->compressor->compressTile (
                _tileBuffer->dataPtr,
                _tileBuffer->dataSize,
                tileRange,
                compPtr);

            if (compSize < _tileBuffer->dataSize)
            {
                _tileBuffer->dataSize = compSize;
                _tileBuffer->dataPtr  = compPtr;
            }
            else if (_ofd->format == Compressor::NATIVE)
            {
                //
                // The data did not shrink during compression, but
                // we cannot write to the file using native format,
                // so we need to convert the lineBuffer to Xdr.
                //

                convertToXdr (
                    _ofd,
                    _tileBuffer->buffer,
                    numScanLines,
                    numPixelsPerScanLine);
            }
        }
    }
    catch (std::exception& e)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = e.what ();
            _tileBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = "unrecognized exception";
            _tileBuffer->hasException = true;
        }
    }
}